

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O1

void __thiscall
r_exec::TimingGuardBuilder::build
          (TimingGuardBuilder *this,Code *mdl,_Fact *premise,_Fact *cause,uint16_t *write_index)

{
  char cVar1;
  ushort uVar2;
  uint16_t t0;
  uint16_t t1;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  (*(mdl->super__Object)._vptr__Object[4])(mdl,1);
  uVar2 = r_code::Atom::asIndex();
  (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar2);
  cVar1 = r_code::Atom::getAtomCount();
  if (cVar1 == '\0') {
    iVar3 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    (**(code **)(*plVar4 + 0x20))(plVar4,2);
    t0 = r_code::Atom::asIndex();
    (**(code **)(*plVar4 + 0x20))(plVar4,3);
    t1 = r_code::Atom::asIndex();
  }
  else {
    t0 = 1;
    t1 = 2;
  }
  _build(this,mdl,t0,t1,write_index);
  return;
}

Assistant:

void TimingGuardBuilder::build(Code *mdl, _Fact *premise, _Fact *cause, uint16_t &write_index) const
{
    uint16_t t0;
    uint16_t t1;
    uint16_t tpl_arg_set_index = mdl->code(MDL_TPL_ARGS).asIndex();

    if (mdl->code(tpl_arg_set_index).getAtomCount() == 0) {
        Code *lhs_val = mdl->get_reference(0);
        t0 = lhs_val->code(FACT_AFTER).asIndex();
        t1 = lhs_val->code(FACT_BEFORE).asIndex();
    } else { // use the tpl args.
        t0 = 1;
        t1 = 2;
    }

    _build(mdl, t0, t1, write_index);
}